

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseUpdate_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  allocator local_279;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  allocator local_159;
  string local_158;
  string local_138;
  allocator local_111;
  string local_110;
  string local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"update_id",&local_59);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,&peVar2->updateId);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"message",&local_81);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_a8,this,&peVar2->message);
    appendToJson(this,__return_storage_ptr__,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"edited_message",&local_c9);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_f0,this,&peVar2->editedMessage);
    appendToJson(this,__return_storage_ptr__,&local_c8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"channel_post",&local_111);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_138,this,&peVar2->channelPost);
    appendToJson(this,__return_storage_ptr__,&local_110,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"edited_channel_post",&local_159);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseMessage_abi_cxx11_(&local_180,this,&peVar2->editedChannelPost);
    appendToJson(this,__return_storage_ptr__,&local_158,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"inline_query",&local_1a1);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseInlineQuery_abi_cxx11_(&local_1c8,this,&peVar2->inlineQuery);
    appendToJson(this,__return_storage_ptr__,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"chosen_inline_result",&local_1e9);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseChosenInlineResult_abi_cxx11_(&local_210,this,&peVar2->chosenInlineResult);
    appendToJson(this,__return_storage_ptr__,&local_1e8,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"callback_query",&local_231);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseCallbackQuery_abi_cxx11_(&local_258,this,&peVar2->callbackQuery);
    appendToJson(this,__return_storage_ptr__,&local_230,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"shipping_query",&local_279);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parseShippingQuery_abi_cxx11_(&local_2a0,this,&peVar2->shippingQuery);
    appendToJson(this,__return_storage_ptr__,&local_278,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c0,"pre_checkout_query",&local_2c1);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    parsePreCheckoutQuery_abi_cxx11_(&local_2e8,this,&peVar2->preCheckoutQuery);
    appendToJson(this,__return_storage_ptr__,&local_2c0,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseUpdate(const Update::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "update_id", object->updateId);
    appendToJson(result, "message", parseMessage(object->message));
    appendToJson(result, "edited_message", parseMessage(object->editedMessage));
    appendToJson(result, "channel_post", parseMessage(object->channelPost));
    appendToJson(result, "edited_channel_post", parseMessage(object->editedChannelPost));
    appendToJson(result, "inline_query", parseInlineQuery(object->inlineQuery));
    appendToJson(result, "chosen_inline_result", parseChosenInlineResult(object->chosenInlineResult));
    appendToJson(result, "callback_query", parseCallbackQuery(object->callbackQuery));
    appendToJson(result, "shipping_query", parseShippingQuery(object->shippingQuery));
    appendToJson(result, "pre_checkout_query", parsePreCheckoutQuery(object->preCheckoutQuery));
    removeLastComma(result);
    result += '}';
    return result;
}